

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O1

void __thiscall
fmcalc::compute_item_proportions
          (fmcalc *this,
          vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
          *agg_vecs,vector<float,_std::allocator<float>_> *guls,uint level_,uint layer_,
          uint previous_layer_,bool allowzeros)

{
  pointer pvVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int *piVar4;
  pointer pfVar5;
  undefined1 auVar6 [16];
  vector<int,_std::allocator<int>_> *__range7;
  float *pfVar7;
  undefined8 *puVar8;
  int *piVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  __node_base _Var13;
  int iVar14;
  long lVar15;
  vector<float,_std::allocator<float>_> *pvVar16;
  long lVar17;
  iterator __position;
  __node_base_ptr *pp_Var18;
  long lVar19;
  long lVar20;
  iterator iter;
  float *pfVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  vector<int,_std::allocator<int>_> v_2;
  vector<float,_std::allocator<float>_> items_prop;
  undefined8 local_c8;
  allocator_type local_bd;
  float local_bc;
  vector<float,_std::allocator<float>_> local_b8;
  vector<float,_std::allocator<float>_> *local_98;
  long *local_90;
  undefined1 local_88 [24];
  ulong local_70;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_98 = guls;
  if (layer_ == 1) {
    local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_68,
               (long)(guls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(guls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&local_b8,
               (allocator_type *)&local_c8);
    uVar25 = level_ + 1;
    if (this->allocrule_ != 3) {
      uVar25 = (int)((ulong)((long)(agg_vecs->
                                   super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(agg_vecs->
                                  super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    }
    pp_Var18 = local_68._M_buckets;
    if (1 < (int)uVar25) {
      local_70 = (ulong)uVar25;
      uVar24 = 1;
      do {
        pvVar1 = (agg_vecs->
                 super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_90 = *(long **)&pvVar1[uVar24 - 1].
                              super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                              ._M_impl.super__Vector_impl_data;
        lVar15 = local_90[3];
        if (lVar15 == local_90[4]) {
          auVar6._12_4_ = 0;
          auVar6._0_12_ = local_88._4_12_;
          local_88._0_16_ = auVar6 << 0x20;
        }
        else {
          fVar26 = 0.0;
          do {
            fVar26 = fVar26 + *(float *)(lVar15 + 8);
            lVar15 = lVar15 + 0x60;
          } while (lVar15 != local_90[4]);
          local_88._0_4_ = (int)CONCAT71((int7)((ulong)lVar15 >> 8),0.01 < fVar26);
        }
        lVar15 = *(long *)&pvVar1[uVar24].
                           super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        pfVar7 = *(float **)(lVar15 + 0x20);
        fVar26 = 0.0;
        for (pfVar21 = *(float **)(lVar15 + 0x18); pfVar21 != pfVar7; pfVar21 = pfVar21 + 0x18) {
          if ((0.0 < *pfVar21) || (0.0 < pfVar21[1] || allowzeros)) {
            plVar2 = *(long **)(pfVar21 + 0xe);
            fVar27 = 0.0;
            if (plVar2 != (long *)0x0) {
              if (*(long *)(pfVar21 + 0x10) == 0) {
                local_c8 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)((ulong)local_c8._4_4_ << 0x20);
                local_bc = fVar26;
                std::vector<float,_std::allocator<float>_>::vector
                          (&local_b8,plVar2[1] - *plVar2 >> 2,(value_type_conflict2 *)&local_c8,
                           &local_bd);
                puVar8 = (undefined8 *)operator_new(0x28);
              }
              else {
                local_c8 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)((ulong)local_c8._4_4_ << 0x20);
                local_bc = fVar26;
                std::vector<float,_std::allocator<float>_>::vector
                          (&local_b8,plVar2[1] - *plVar2 >> 2,(value_type_conflict2 *)&local_c8,
                           &local_bd);
                puVar8 = (undefined8 *)operator_new(0x28);
              }
              puVar8[1] = 0x100000001;
              *puVar8 = &PTR___Sp_counted_ptr_inplace_00115cf8;
              puVar8[2] = local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start;
              puVar8[3] = local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              puVar8[4] = local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
              local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              *(undefined8 **)(pfVar21 + 0x10) = puVar8 + 2;
              p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pfVar21 + 0x12);
              *(undefined8 **)(pfVar21 + 0x12) = puVar8;
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              }
              if ((__node_base_ptr *)
                  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (__node_base_ptr *)0x0) {
                operator_delete(local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              piVar9 = (int *)**(undefined8 **)(pfVar21 + 0xe);
              piVar4 = (int *)(*(undefined8 **)(pfVar21 + 0xe))[1];
              fVar27 = 0.0;
              fVar26 = local_bc;
              if (piVar9 != piVar4) {
                do {
                  fVar27 = fVar27 + (guls->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_start[*piVar9];
                  piVar9 = piVar9 + 1;
                } while (piVar9 != piVar4);
              }
            }
            pfVar21[3] = fVar27;
            fVar26 = fVar26 + *pfVar21;
          }
          else {
            pfVar21[3] = 0.0;
          }
          pfVar7 = *(float **)(lVar15 + 0x20);
        }
        pfVar21 = *(float **)(lVar15 + 0x18);
        if ((fVar26 <= 0.0 & local_88[0]) == 1) {
          for (; pfVar21 != pfVar7; pfVar21 = pfVar21 + 0x18) {
            puVar8 = *(undefined8 **)(pfVar21 + 0xe);
            if (puVar8 != (undefined8 *)0x0) {
              piVar9 = (int *)*puVar8;
              piVar4 = (int *)puVar8[1];
              if (piVar9 != piVar4) {
                fVar26 = pfVar21[2];
                do {
                  fVar26 = fVar26 + *(float *)((long)local_68._M_buckets + (long)*piVar9 * 4);
                  pfVar21[2] = fVar26;
                  piVar9 = piVar9 + 1;
                } while (piVar9 != piVar4);
              }
            }
          }
        }
        else if (pfVar21 != *(float **)(lVar15 + 0x20)) {
          uVar25 = -(uint)(0.0 < fVar26);
          lVar23 = 0;
          local_88._0_16_ = ZEXT416(uVar25);
          local_bc = fVar26;
          do {
            pfVar21[2] = (float)(-(uint)(0.0 < *pfVar21) & (uint)(*pfVar21 / fVar26) & uVar25);
            plVar2 = *(long **)(pfVar21 + 0xe);
            fVar27 = 0.0;
            if (uVar24 == 1) {
              if (plVar2 != (long *)0x0) {
                piVar9 = (int *)*plVar2;
                if (piVar9 != (int *)plVar2[1]) {
                  do {
                    fVar27 = fVar27 + (local_98->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data._M_start[*piVar9];
                    piVar9 = piVar9 + 1;
                  } while (piVar9 != (int *)plVar2[1]);
                }
              }
              if (0.0 < fVar27) {
                lVar22 = *plVar2;
                lVar17 = plVar2[1];
                if (lVar22 != lVar17) {
                  plVar2 = *(long **)(pfVar21 + 0x10);
                  pfVar5 = (local_98->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  lVar19 = 0;
                  do {
                    lVar20 = (long)*(int *)(lVar22 + lVar19);
                    if (plVar2 != (long *)0x0) {
                      *(float *)(*plVar2 + lVar19) = pfVar5[lVar20] / pfVar21[3];
                    }
                    *(float *)((long)local_68._M_buckets + lVar20 * 4) =
                         (pfVar5[lVar20] / fVar27) * pfVar21[2];
                    lVar20 = lVar22 + lVar19;
                    lVar19 = lVar19 + 4;
                  } while (lVar20 + 4 != lVar17);
                }
              }
            }
            else {
              if (plVar2 != (long *)0x0) {
                for (piVar9 = (int *)*plVar2; piVar9 != (int *)plVar2[1]; piVar9 = piVar9 + 1) {
                  fVar27 = fVar27 + *(float *)((long)local_68._M_buckets + (long)*piVar9 * 4);
                }
              }
              if (fVar27 <= 0.0) {
                if (plVar2 != (long *)0x0) {
                  lVar22 = local_90[3] + lVar23 * 0x60;
                  *(undefined8 *)(pfVar21 + 0x10) = *(undefined8 *)(lVar22 + 0x40);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pfVar21 + 0x12),
                             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar22 + 0x48));
                  fVar26 = local_bc;
                  uVar25 = local_88._0_4_;
                }
              }
              else if (plVar2 != (long *)0x0) {
                lVar22 = *plVar2;
                lVar17 = plVar2[1];
                if (lVar22 != lVar17) {
                  plVar2 = *(long **)(pfVar21 + 0x10);
                  lVar19 = 0;
                  do {
                    lVar20 = (long)*(int *)(lVar22 + lVar19);
                    if (plVar2 != (long *)0x0) {
                      *(float *)(*plVar2 + lVar19) =
                           *(float *)((long)local_68._M_buckets + lVar20 * 4) / fVar27;
                    }
                    *(float *)((long)local_68._M_buckets + lVar20 * 4) =
                         (*(float *)((long)local_68._M_buckets + lVar20 * 4) / fVar27) * pfVar21[2];
                    lVar20 = lVar22 + lVar19;
                    lVar19 = lVar19 + 4;
                  } while (lVar20 + 4 != lVar17);
                }
              }
            }
            pfVar21 = pfVar21 + 0x18;
            lVar23 = lVar23 + 1;
          } while (pfVar21 != *(float **)(lVar15 + 0x20));
        }
        uVar24 = uVar24 + 1;
        pp_Var18 = local_68._M_buckets;
        guls = local_98;
      } while (uVar24 != local_70);
    }
  }
  else {
    if (previous_layer_ < layer_) {
      lVar15 = *(long *)&(agg_vecs->
                         super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[level_].
                         super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                         ._M_impl.super__Vector_impl_data;
      uVar10 = (ulong)layer_;
      lVar23 = *(long *)(lVar15 + 0x20) - *(long *)(lVar15 + 0x18) >> 5;
      uVar12 = lVar23 * -0x5555555555555555;
      uVar24 = (*(long *)(lVar15 + 8 + uVar10 * 0x18) - *(long *)(lVar15 + uVar10 * 0x18) >> 5) *
               -0x5555555555555555;
      if (uVar24 < uVar12 || uVar24 + lVar23 * 0x5555555555555555 == 0) {
        uVar24 = uVar12;
      }
      if (uVar24 == 0) {
        return;
      }
      lVar23 = 0x48;
      do {
        lVar22 = *(long *)(lVar15 + 0x18);
        lVar17 = *(long *)(lVar15 + uVar10 * 0x18);
        *(undefined4 *)(lVar17 + -0x40 + lVar23) = *(undefined4 *)(lVar22 + -0x40 + lVar23);
        *(undefined8 *)(lVar17 + -8 + lVar23) = *(undefined8 *)(lVar22 + -8 + lVar23);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar17 + lVar23),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar22 + lVar23));
        lVar23 = lVar23 + 0x60;
        uVar24 = uVar24 - 1;
      } while (uVar24 != 0);
      return;
    }
    lVar15 = *(long *)&(agg_vecs->
                       super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[level_ - 1].
                       super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                       ._M_impl.super__Vector_impl_data;
    local_90 = (long *)(lVar15 + (ulong)previous_layer_ * 0x18);
    lVar23 = *local_90;
    if (local_90[1] != lVar23) {
      lVar22 = 0x48;
      uVar24 = 0;
      do {
        if (*(long *)(lVar23 + -8 + lVar22) == 0) {
          lVar17 = *(long *)(lVar15 + 0x18);
          *(undefined8 *)(lVar23 + -8 + lVar22) = *(undefined8 *)(lVar17 + -8 + lVar22);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar23 + lVar22),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar17 + lVar22));
        }
        uVar24 = uVar24 + 1;
        lVar23 = *local_90;
        lVar22 = lVar22 + 0x60;
      } while (uVar24 < (ulong)((local_90[1] - lVar23 >> 5) * -0x5555555555555555));
    }
    local_68._M_buckets = (__buckets_ptr)CONCAT44(local_68._M_buckets._4_4_,0xffffffff);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_b8,
               (long)(local_98->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(local_98->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&local_68,
               (allocator_type *)&local_c8);
    lVar15 = *local_90;
    lVar23 = local_90[1];
    if (lVar15 != lVar23) {
      iVar14 = 0;
      do {
        puVar8 = *(undefined8 **)(lVar15 + 0x38);
        if (puVar8 != (undefined8 *)0x0) {
          piVar4 = (int *)puVar8[1];
          for (piVar9 = (int *)*puVar8; piVar9 != piVar4; piVar9 = piVar9 + 1) {
            *(int *)((long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + (long)*piVar9 * 4) = iVar14;
          }
        }
        iVar14 = iVar14 + 1;
        lVar15 = lVar15 + 0x60;
      } while (lVar15 != lVar23);
    }
    uVar24 = (ulong)layer_;
    lVar15 = *(long *)&(agg_vecs->
                       super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[level_].
                       super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                       ._M_impl.super__Vector_impl_data;
    lVar23 = *(long *)(lVar15 + uVar24 * 0x18);
    pp_Var18 = (__node_base_ptr *)
               local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (*(long *)(lVar15 + 8 + uVar24 * 0x18) != lVar23) {
      pvVar16 = (vector<float,_std::allocator<float>_> *)0x0;
      do {
        lVar15 = (long)pvVar16 * 0x60;
        puVar8 = *(undefined8 **)(lVar23 + 0x38 + lVar15);
        if (puVar8 != (undefined8 *)0x0) {
          piVar9 = (int *)*puVar8;
          local_68._M_buckets = &local_68._M_single_bucket;
          local_68._M_bucket_count = 1;
          local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_68._M_element_count = 0;
          local_68._M_rehash_policy._M_max_load_factor = 1.0;
          local_68._M_rehash_policy._M_next_resize = 0;
          local_68._M_single_bucket = (__node_base_ptr)0x0;
          local_98 = pvVar16;
          for (; puVar8 = *(undefined8 **)
                           (*(long *)(*(long *)&(agg_vecs->
                                                super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start[level_].
                                                super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                                ._M_impl.super__Vector_impl_data + uVar24 * 0x18) +
                            0x38 + lVar15), piVar9 != (int *)puVar8[1]; piVar9 = piVar9 + 1) {
            local_c8 = &local_68;
            std::
            _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                      ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_68,
                       (long)*piVar9 * 4 +
                       (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start,&local_c8);
          }
          if (local_68._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
            local_bc = 0.0;
          }
          else {
            local_bc = 0.0;
            _Var13._M_nxt = local_68._M_before_begin._M_nxt;
            do {
              local_bc = local_bc +
                         *(float *)(*local_90 + (long)*(int *)&_Var13._M_nxt[1]._M_nxt * 0x60);
              _Var13._M_nxt = (_Var13._M_nxt)->_M_nxt;
            } while (_Var13._M_nxt != (_Hash_node_base *)0x0);
          }
          for (piVar9 = (int *)*puVar8;
              lVar23 = *(long *)(*(long *)&(agg_vecs->
                                           super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start[level_].
                                           super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar24 * 0x18),
              piVar9 != *(int **)(*(long *)(lVar23 + 0x38 + lVar15) + 8); piVar9 = piVar9 + 1) {
            if (*(long *)(lVar23 + 0x40 + lVar15) == 0) {
              puVar8 = (undefined8 *)operator_new(0x28);
              puVar8[1] = 0x100000001;
              *puVar8 = &PTR___Sp_counted_ptr_inplace_00115cf8;
              puVar8[2] = 0;
              puVar8[3] = 0;
              puVar8[4] = 0;
              lVar23 = *(long *)(*(long *)&(agg_vecs->
                                           super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start[level_].
                                           super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar24 * 0x18);
              *(undefined8 **)(lVar23 + 0x40 + lVar15) = puVar8 + 2;
              p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar23 + 0x48 + lVar15);
              *(undefined8 **)(lVar23 + 0x48 + lVar15) = puVar8;
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              }
            }
            if (local_bc <= 0.0) {
              pvVar16 = *(vector<float,_std::allocator<float>_> **)
                         (*(long *)(*(long *)&(agg_vecs->
                                              super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start[level_].
                                              super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                              ._M_impl.super__Vector_impl_data + uVar24 * 0x18) +
                          0x40 + lVar15);
              local_c8 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)((ulong)local_c8._4_4_ << 0x20);
              __position._M_current =
                   (pvVar16->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (pvVar16->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (pvVar16,__position,(float *)&local_c8);
              }
              else {
LAB_00103478:
                *__position._M_current = 0.0;
LAB_0010347e:
                (pvVar16->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
            }
            else {
              lVar23 = *local_90;
              lVar17 = (long)*(int *)((long)local_b8.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                     (long)*piVar9 * 4) * 0x60;
              plVar2 = *(long **)(lVar23 + 0x38 + lVar17);
              lVar22 = *plVar2;
              uVar25 = 0xffffffff;
              lVar19 = plVar2[1] - lVar22;
              if (lVar19 != 0) {
                lVar19 = lVar19 >> 2;
                lVar20 = 0;
                do {
                  if (*(int *)(lVar22 + lVar20 * 4) == *piVar9) {
                    uVar25 = (uint)lVar20;
                    break;
                  }
                  lVar20 = lVar20 + 1;
                } while (lVar19 + (ulong)(lVar19 == 0) != lVar20);
              }
              if ((int)uVar25 < 0) {
                pvVar16 = *(vector<float,_std::allocator<float>_> **)
                           (*(long *)(*(long *)&(agg_vecs->
                                                super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start[level_].
                                                super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                                ._M_impl.super__Vector_impl_data + uVar24 * 0x18) +
                            0x40 + lVar15);
                local_c8 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)((ulong)local_c8._4_4_ << 0x20);
                __position._M_current =
                     (pvVar16->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current !=
                    (pvVar16->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) goto LAB_00103478;
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (pvVar16,__position,(float *)&local_c8);
              }
              else {
                pvVar16 = *(vector<float,_std::allocator<float>_> **)
                           (*(long *)(*(long *)&(agg_vecs->
                                                super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start[level_].
                                                super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                                ._M_impl.super__Vector_impl_data + uVar24 * 0x18) +
                            0x40 + lVar15);
                if (*(float *)(lVar17 + lVar23) <= 0.0) {
                  local_c8 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)((ulong)local_c8._4_4_ << 0x20);
                  __position._M_current =
                       (pvVar16->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current !=
                      (pvVar16->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) goto LAB_00103478;
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (pvVar16,__position,(float *)&local_c8);
                }
                else {
                  lVar17 = (long)*(int *)((long)local_b8.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_start +
                                         (long)*piVar9 * 4) * 0x60;
                  plVar2 = *(long **)(lVar23 + 0x40 + lVar17);
                  lVar22 = *plVar2;
                  if ((ulong)(plVar2[1] - lVar22 >> 2) <= (ulong)uVar25) {
                    uVar11 = std::__throw_out_of_range_fmt
                                       (
                                       "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       );
                    _Unwind_Resume(uVar11);
                  }
                  fVar26 = (*(float *)(lVar23 + lVar17) * *(float *)(lVar22 + (ulong)uVar25 * 4)) /
                           local_bc;
                  local_c8 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)CONCAT44(local_c8._4_4_,fVar26);
                  __position._M_current =
                       (pvVar16->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current !=
                      (pvVar16->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    *__position._M_current = fVar26;
                    goto LAB_0010347e;
                  }
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (pvVar16,__position,(float *)&local_c8);
                }
              }
            }
          }
          std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_68);
          pvVar16 = local_98;
        }
        pvVar16 = (vector<float,_std::allocator<float>_> *)
                  ((long)&(pvVar16->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + 1);
        lVar15 = *(long *)&(agg_vecs->
                           super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[level_].
                           super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        lVar23 = *(long *)(lVar15 + uVar24 * 0x18);
        pp_Var18 = (__node_base_ptr *)
                   local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (pvVar16 < (vector<float,_std::allocator<float>_> *)
                         ((*(long *)(lVar15 + 8 + uVar24 * 0x18) - lVar23 >> 5) *
                         -0x5555555555555555));
    }
  }
  if (pp_Var18 != (__node_base_ptr *)0x0) {
    operator_delete(pp_Var18);
  }
  return;
}

Assistant:

void fmcalc::compute_item_proportions(std::vector<std::vector<std::vector <LossRec>>> &agg_vecs, const std::vector<OASIS_FLOAT> &guls, unsigned int level_, unsigned int layer_,unsigned int previous_layer_,bool allowzeros)
{

	if (layer_ == 1) {
		std::vector<OASIS_FLOAT> items_prop (guls.size(), 0);
		int from_level = 1;
		int to_level = agg_vecs.size();
		if (allocrule_ == 3) {
			from_level = level_;
			to_level = from_level + 1;
		}
		for (int level = 1; level < to_level; level++) {
			vector <LossRec> &agg_vec = agg_vecs[level][layer_];
			vector <LossRec>& previous_agg_vec = agg_vecs[level-1][layer_];
			OASIS_FLOAT loss_total = 0;
			OASIS_FLOAT retained_loss_total = 0;
			OASIS_FLOAT previous_proportions_total = 0;
			auto p_iter = previous_agg_vec.begin();
			while (p_iter != previous_agg_vec.end()) {
				previous_proportions_total += p_iter->proportion;
				p_iter++;
			}
			auto iter = agg_vec.begin();
 			while (iter != agg_vec.end()) {
				if (iter->loss > 0 || iter->retained_loss > 0 || allowzeros == true) {
					OASIS_FLOAT total = 0;
					if (iter->item_idx) {
						if (iter->item_prop == nullptr) {
							iter->item_prop = std::make_shared<std::vector<OASIS_FLOAT>>(std::vector<OASIS_FLOAT>((iter->item_idx)->size(), 0));
						}
						else {
							//(iter->item_prop)->resize((iter->item_idx)->size(), 0);
							iter->item_prop = std::make_shared<std::vector<OASIS_FLOAT>>(std::vector<OASIS_FLOAT>((iter->item_idx)->size(), 0));
						}
						for (int idx : *(iter->item_idx)) {	// if this is the first level there should only be one item_idx
							total += guls[idx];
						}
					}
					iter->gul_total = total;
					loss_total += iter->loss;
					retained_loss_total += iter->retained_loss;
				}
				else {
					iter->gul_total = 0;
					retained_loss_total += iter->retained_loss;
				}
				iter++;
			}
			if (loss_total <= 0 && previous_proportions_total > 0.01) {
				// check level and layer_
				// if there is no loss_total loss just copy previous level proportions
				auto iter = agg_vec.begin();		// loop through again to work out proportion
				//auto previous_iter = previous_agg_vec.begin();		// loop through again to work out proportion
				while (iter != agg_vec.end()) {
					if (iter->item_idx) {
						for (int idx : *(iter->item_idx)) {
							//std::vector<OASIS_FLOAT>& v = *(iter->item_prop);
							iter->proportion = iter->proportion + items_prop[idx];
						}
					}
					iter++;
				}
			}
			else {
				iter = agg_vec.begin();		// loop thru again to work out proportion
				int agg_vec_idx = 0;
				while (iter != agg_vec.end()) {
					if (iter->loss > 0 && loss_total > 0) {
						iter->proportion = iter->loss / loss_total;
					}
					else {
						iter->proportion = 0;
					}
					if (level == 1) {
						OASIS_FLOAT total = 0;
						if (iter->item_idx) {
							for (int idx : *(iter->item_idx)) {
								total += guls[idx];
							}
						}
						int i = 0;
						if (total > 0) {
							for (int idx : *(iter->item_idx)) {
								if (iter->item_prop != nullptr) {
									std::vector<OASIS_FLOAT>& v = *(iter->item_prop);
									v[i] = guls[idx] / iter->gul_total;
								}
								items_prop[idx] = (guls[idx] / total) * iter->proportion;
								i++;
							}
						}
					}
					else {
						OASIS_FLOAT prop_total = 0;
						if (iter->item_idx) {
							for (int idx : *(iter->item_idx)) {
								prop_total += items_prop[idx];
							}
						}
						int i = 0;
						if (prop_total > 0) {
							if (iter->item_idx) {
								for (int idx : *(iter->item_idx)) {
									if (iter->item_prop != nullptr) {
										std::vector<OASIS_FLOAT>& v = *(iter->item_prop);
										v[i] = items_prop[idx] / prop_total;
									}
									items_prop[idx] = (items_prop[idx] / prop_total) * iter->proportion;									
									i++;
								}
							}
						}
						else {
							if (iter->item_idx) {
								iter->item_prop = previous_agg_vec[agg_vec_idx].item_prop;
								//iter->limit_surplus = 5678;
							}
						}
					}
					iter++;
					agg_vec_idx++;
				}
			}			
		}
	}
	else {
		if (previous_layer_ < layer_) {
			vector <LossRec> &prev_agg_vec = agg_vecs[level_][1];
			vector <LossRec> &current_agg_vec = agg_vecs[level_][layer_];
			size_t iMax =  prev_agg_vec.size();
			if (current_agg_vec.size() > iMax) iMax = current_agg_vec.size();
			for (size_t i = 0; i < iMax; i++) {
				current_agg_vec[i].proportion = prev_agg_vec[i].proportion;
				current_agg_vec[i].item_prop = prev_agg_vec[i].item_prop;
			}			
		}
		else {			
			vector <LossRec> &prev_agg_vec = agg_vecs[level_ - 1][previous_layer_];
			vector <LossRec> &prev_agg_vec_base = agg_vecs[level_ - 1][1];
			for (size_t i = 0; i < prev_agg_vec.size(); i++) {
				//if (prev_agg_vec[i].item_prop->size() == 0) {
				if (prev_agg_vec[i].item_prop == nullptr) {
					//prev_agg_vec[i].loss = prev_agg_vec_base[i].loss;
					prev_agg_vec[i].item_prop = prev_agg_vec_base[i].item_prop;
				}
			}
			//

			std::vector<int> v(guls.size(), -1);
			//v.resize(guls.size(), -1);
			auto iter = prev_agg_vec.begin();
			int j = 0;

			while (iter != prev_agg_vec.end()) {
				if (iter->item_idx) {
					auto it = iter->item_idx->begin();
					while (it != iter->item_idx->end()) {
						v[*it] = j;
						it++;
					}
				}
				j++;
				iter++;
			}
			for (size_t y = 0; y < agg_vecs[level_][layer_].size(); y++) {
				if (agg_vecs[level_][layer_][y].item_idx != nullptr) {
					auto it = agg_vecs[level_][layer_][y].item_idx->begin();
					// 1 create an item id  to prev_agg_vec index
					// 2 use below loop to create a set which will then be used to iterate and get previous_gul_total
					std::unordered_set<int> s;
					while (it != agg_vecs[level_][layer_][y].item_idx->end()) {
						s.insert(v[*it]);
						//prev_gul_total += prev_agg_vec[*it].loss;
						it++;
					}

					OASIS_FLOAT prev_gul_total = 0;
					auto s_iter = s.begin();
					while (s_iter != s.end()) {
						prev_gul_total += prev_agg_vec[*s_iter].loss;
						s_iter++;
					}

					// agg_vecs[level_][layer_][y].loss = prev_gul_total;
					it = agg_vecs[level_][layer_][y].item_idx->begin();
					while (it != agg_vecs[level_][layer_][y].item_idx->end()) {
						if (agg_vecs[level_][layer_][y].item_prop == nullptr) {
							agg_vecs[level_][layer_][y].item_prop = std::make_shared<std::vector<OASIS_FLOAT>>(std::vector<OASIS_FLOAT>());
						}
						if (prev_gul_total > 0) {
							int j = -1;
							const std::vector<int>& z = *(prev_agg_vec[v[*it]].item_idx);
							for (size_t i = 0; i < z.size(); i++) {
								if (z[i] == *it) {
									j = i;
									break;
								}
							}
							// this is recomputing the first layers proportions
							if (j > -1) {
								if (prev_agg_vec[v[*it]].loss > 0 ) agg_vecs[level_][layer_][y].item_prop->push_back(prev_agg_vec[v[*it]].loss * prev_agg_vec[v[*it]].item_prop->at(j) / prev_gul_total);
								else agg_vecs[level_][layer_][y].item_prop->push_back(0);
							}
							else {
								agg_vecs[level_][layer_][y].item_prop->push_back(0);
							}

						}
						else {
							agg_vecs[level_][layer_][y].item_prop->push_back(0);
						}
						it++;
					}
				}
			}
		}		
		return;

	}
}